

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O3

void decode_string(uint8_t *dst,uint8_t *src)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  long lVar6;
  
  bVar3 = *src;
  uVar1 = 0;
  if (bVar3 != 0) {
    lVar2 = 0;
    do {
      uVar5 = bca[bVar3][0];
      if (uVar5 != '\0') {
        puVar4 = dst + (int)uVar1;
        lVar6 = 0x1150f1;
        do {
          *puVar4 = uVar5;
          uVar5 = *(uint8_t *)(lVar6 + (ulong)src[lVar2] * 3);
          puVar4 = puVar4 + 1;
          uVar1 = (ulong)((int)uVar1 + 1);
          lVar6 = lVar6 + 1;
        } while (uVar5 != '\0');
      }
      bVar3 = src[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (bVar3 != 0);
    uVar1 = (ulong)(int)uVar1;
  }
  dst[uVar1] = '\0';
  return;
}

Assistant:

void decode_string(uint8_t dst[], uint8_t src[]) {
    int j = 0;
    for (int i = 0; src[i]; i++) {
        for (int k = 0; bca[src[i]][k]; ++k) {
            dst[j++] = bca[src[i]][k];
        }
    }
    dst[j] = '\0'; //terminator
}